

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.c
# Opt level: O0

void pub0_pipe_send_cb(void *arg)

{
  nng_err nVar1;
  int iVar2;
  nni_msg *m;
  nni_msg *local_28;
  nni_msg *msg;
  pub0_sock *sock;
  pub0_pipe *p;
  void *arg_local;
  
  msg = *(nni_msg **)((long)arg + 8);
  sock = (pub0_sock *)arg;
  p = (pub0_pipe *)arg;
  nVar1 = nni_aio_result((nni_aio *)((long)arg + 0x60));
  if (nVar1 == NNG_OK) {
    nni_mtx_lock((nni_mtx *)(msg->m_header_buf + 6));
    if (((sock->sendable).p_raised.v & 1U) == 0) {
      iVar2 = nni_lmq_get((nni_lmq *)&(sock->pipes).ll_offset,&local_28);
      if (iVar2 == 0) {
        nni_aio_set_msg((nni_aio *)(sock + 1),local_28);
        nni_pipe_send((nni_pipe *)(sock->pipes).ll_head.ln_next,(nni_aio *)(sock + 1));
      }
      else {
        (sock->sendable).field_0x9 = 0;
      }
      nni_mtx_unlock((nni_mtx *)(msg->m_header_buf + 6));
    }
    else {
      nni_mtx_unlock((nni_mtx *)(msg->m_header_buf + 6));
    }
  }
  else {
    m = nni_aio_get_msg((nni_aio *)(sock + 1));
    nni_msg_free(m);
    nni_aio_set_msg((nni_aio *)(sock + 1),(nni_msg *)0x0);
    nni_pipe_close((nni_pipe *)(sock->pipes).ll_head.ln_next);
  }
  return;
}

Assistant:

static void
pub0_pipe_send_cb(void *arg)
{
	pub0_pipe *p    = arg;
	pub0_sock *sock = p->pub;
	nni_msg   *msg;

	if (nni_aio_result(&p->aio_send) != 0) {
		nni_msg_free(nni_aio_get_msg(&p->aio_send));
		nni_aio_set_msg(&p->aio_send, NULL);
		nni_pipe_close(p->pipe);
		return;
	}

	nni_mtx_lock(&sock->mtx);
	if (p->closed) {
		nni_mtx_unlock(&sock->mtx);
		return;
	}
	if (nni_lmq_get(&p->sendq, &msg) == 0) {
		nni_aio_set_msg(&p->aio_send, msg);
		nni_pipe_send(p->pipe, &p->aio_send);
	} else {
		p->busy = false;
	}
	nni_mtx_unlock(&sock->mtx);
}